

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O3

string * __thiscall HTTPRequest::str_abi_cxx11_(string *__return_storage_ptr__,HTTPRequest *this)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  long *plVar5;
  undefined8 *puVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  size_type *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  HTTPRequest *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar2 = (this->method)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (this->method)._M_string_length);
  std::__cxx11::string::append((char *)local_50);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_50,(ulong)(this->uri)._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_68 = *plVar8;
    lStack_60 = plVar5[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar8;
    local_78 = (long *)*plVar5;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_90 = *plVar8;
    lStack_88 = plVar5[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar8;
    local_a0 = (long *)*plVar5;
  }
  local_98 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_80 = this;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(this->version)._M_dataplus._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_b8 = *plVar8;
    lStack_b0 = plVar5[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar8;
    local_c8 = (long *)*plVar5;
  }
  local_c0 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    lVar3 = plVar5[3];
    local_58->_M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  local_a8 = __return_storage_ptr__;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  p_Var7 = (local_80->header)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_80->header)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      local_78 = &local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      std::__cxx11::string::append((char *)&local_78);
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_78,*(ulong *)(p_Var7 + 2));
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_90 = *plVar5;
        lStack_88 = puVar6[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar5;
        local_a0 = (long *)*puVar6;
      }
      local_98 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_b8 = *plVar5;
        lStack_b0 = puVar6[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar5;
        local_c8 = (long *)*puVar6;
      }
      local_c0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_c8);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  psVar4 = local_a8;
  if (0 < local_80->content_length) {
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,local_80->content,local_80->content + local_80->content_length);
    std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_c8);
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
  }
  return psVar4;
}

Assistant:

std::string HTTPRequest::str() {
    auto result = this->method + " " + this->uri + " " + this->version + "\n";
    for (auto && i : this->header) {
        result += std::get<0>(i) + ": " + std::get<1>(i) + "\n";
    }
    if (this->content_length > 0) {
        result += std::string(this->content, this->content_length * sizeof(char));
    }
    return result;
}